

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::load_module(Server *this,string *module)

{
  const_iterator cVar1;
  mapped_type pvVar2;
  mapped_type *ppvVar3;
  code *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&available_modules_abi_cxx11_._M_t,module);
  if ((_Rb_tree_header *)cVar1._M_node !=
      &available_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::operator+(&local_60,"libmodule_",module);
    std::operator+(&local_40,&local_60,".so");
    pvVar2 = (mapped_type)dlopen(local_40._M_dataplus._M_p,2);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    ppvVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
              ::operator[](&this->loaded_modules,module);
    *ppvVar3 = pvVar2;
    pcVar4 = (code *)dlsym(pvVar2,"module_load");
    (*pcVar4)(this);
  }
  return;
}

Assistant:

void Server::load_module(std::string module) {
    if (available_modules.find(module) != available_modules.end()) {
        auto handle = dlopen(("libmodule_" + module + ".so").c_str(), RTLD_NOW);
        this->loaded_modules[module] = handle;
        auto module_load = (ModuleLoad) dlsym(handle, "module_load");
        module_load(this);
    }
}